

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_impl.h
# Opt level: O3

void secp256k1_scalar_split_lambda(secp256k1_scalar *r1,secp256k1_scalar *r2,secp256k1_scalar *k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  uint64_t l [8];
  undefined1 local_b8 [16];
  ulong local_a8;
  ulong uStack_a0;
  uint64_t local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ulong local_48;
  ulong uStack_40;
  
  uVar91 = k->d[0];
  uVar92 = k->d[1];
  uVar93 = k->d[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar91;
  uVar94 = SUB168(auVar1 * ZEXT816(0xe893209a45dbb031),8);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar94;
  local_98 = SUB168(auVar1 * ZEXT816(0xe893209a45dbb031),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar91;
  auVar2 = auVar2 * ZEXT816(0x3daa8a1471e8ca7f);
  uVar99 = SUB168(auVar2 + auVar85,0);
  uVar104 = SUB168(auVar2 + auVar85,8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar92;
  uVar95 = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),8);
  uVar90 = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),0);
  local_90 = uVar99 + uVar90;
  uVar90 = (ulong)CARRY8(uVar99,uVar90);
  uVar99 = uVar104 + uVar95;
  uVar105 = uVar99 + uVar90;
  uVar106 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar94,auVar2._0_8_)) +
            (ulong)(CARRY8(uVar104,uVar95) || CARRY8(uVar99,uVar90));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar91;
  uVar96 = SUB168(auVar4 * ZEXT816(0xe86c90e49284eb15),8);
  uVar90 = SUB168(auVar4 * ZEXT816(0xe86c90e49284eb15),0);
  uVar94 = uVar105 + uVar90;
  uVar90 = (ulong)CARRY8(uVar105,uVar90);
  uVar95 = uVar106 + uVar96;
  uVar107 = uVar95 + uVar90;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar92;
  uVar97 = SUB168(auVar5 * ZEXT816(0x3daa8a1471e8ca7f),8);
  uVar99 = SUB168(auVar5 * ZEXT816(0x3daa8a1471e8ca7f),0);
  uVar105 = uVar94 + uVar99;
  uVar99 = (ulong)CARRY8(uVar94,uVar99);
  uVar104 = uVar107 + uVar97;
  uVar108 = uVar104 + uVar99;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar93;
  uVar98 = SUB168(auVar6 * ZEXT816(0xe893209a45dbb031),8);
  uVar94 = SUB168(auVar6 * ZEXT816(0xe893209a45dbb031),0);
  local_88 = uVar105 + uVar94;
  uVar94 = (ulong)CARRY8(uVar105,uVar94);
  uVar105 = uVar108 + uVar98;
  uVar109 = uVar105 + uVar94;
  uVar100 = (ulong)(CARRY8(uVar106,uVar96) || CARRY8(uVar95,uVar90)) +
            (ulong)(CARRY8(uVar107,uVar97) || CARRY8(uVar104,uVar99)) +
            (ulong)(CARRY8(uVar108,uVar98) || CARRY8(uVar105,uVar94));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar91;
  uVar98 = SUB168(auVar7 * ZEXT816(0x3086d221a7d46bcd),8);
  uVar91 = SUB168(auVar7 * ZEXT816(0x3086d221a7d46bcd),0);
  uVar94 = uVar109 + uVar91;
  uVar90 = (ulong)CARRY8(uVar109,uVar91);
  uVar104 = uVar100 + uVar98;
  uVar109 = uVar104 + uVar90;
  uVar91 = k->d[3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar92;
  uVar106 = SUB168(auVar8 * ZEXT816(0xe86c90e49284eb15),8);
  uVar99 = SUB168(auVar8 * ZEXT816(0xe86c90e49284eb15),0);
  uVar95 = uVar94 + uVar99;
  uVar99 = (ulong)CARRY8(uVar94,uVar99);
  uVar105 = uVar109 + uVar106;
  uVar101 = uVar105 + uVar99;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar93;
  uVar107 = SUB168(auVar9 * ZEXT816(0x3daa8a1471e8ca7f),8);
  uVar94 = SUB168(auVar9 * ZEXT816(0x3daa8a1471e8ca7f),0);
  uVar97 = uVar95 + uVar94;
  uVar94 = (ulong)CARRY8(uVar95,uVar94);
  uVar96 = uVar101 + uVar107;
  uVar102 = uVar96 + uVar94;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar91;
  uVar108 = SUB168(auVar10 * ZEXT816(0xe893209a45dbb031),8);
  uVar95 = SUB168(auVar10 * ZEXT816(0xe893209a45dbb031),0);
  local_80 = uVar97 + uVar95;
  uVar95 = (ulong)CARRY8(uVar97,uVar95);
  uVar97 = uVar102 + uVar108;
  uVar103 = uVar97 + uVar95;
  uVar98 = (ulong)(CARRY8(uVar100,uVar98) || CARRY8(uVar104,uVar90)) +
           (ulong)(CARRY8(uVar109,uVar106) || CARRY8(uVar105,uVar99)) +
           (ulong)(CARRY8(uVar101,uVar107) || CARRY8(uVar96,uVar94)) +
           (ulong)(CARRY8(uVar102,uVar108) || CARRY8(uVar97,uVar95));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar92;
  uVar105 = SUB168(auVar11 * ZEXT816(0x3086d221a7d46bcd),8);
  uVar92 = SUB168(auVar11 * ZEXT816(0x3086d221a7d46bcd),0);
  uVar99 = uVar103 + uVar92;
  uVar92 = (ulong)CARRY8(uVar103,uVar92);
  uVar94 = uVar98 + uVar105;
  uVar106 = uVar94 + uVar92;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar93;
  uVar96 = SUB168(auVar12 * ZEXT816(0xe86c90e49284eb15),8);
  uVar90 = SUB168(auVar12 * ZEXT816(0xe86c90e49284eb15),0);
  uVar104 = uVar99 + uVar90;
  uVar90 = (ulong)CARRY8(uVar99,uVar90);
  uVar95 = uVar106 + uVar96;
  uVar107 = uVar95 + uVar90;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar91;
  uVar97 = SUB168(auVar13 * ZEXT816(0x3daa8a1471e8ca7f),8);
  uVar99 = SUB168(auVar13 * ZEXT816(0x3daa8a1471e8ca7f),0);
  local_78 = uVar104 + uVar99;
  uVar99 = (ulong)CARRY8(uVar104,uVar99);
  uVar104 = uVar107 + uVar97;
  uVar108 = uVar104 + uVar99;
  uVar104 = (ulong)(CARRY8(uVar98,uVar105) || CARRY8(uVar94,uVar92)) +
            (ulong)(CARRY8(uVar106,uVar96) || CARRY8(uVar95,uVar90)) +
            (ulong)(CARRY8(uVar107,uVar97) || CARRY8(uVar104,uVar99));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar93;
  uVar94 = SUB168(auVar14 * ZEXT816(0x3086d221a7d46bcd),8);
  uVar92 = SUB168(auVar14 * ZEXT816(0x3086d221a7d46bcd),0);
  uVar99 = uVar108 + uVar92;
  uVar92 = (ulong)CARRY8(uVar108,uVar92);
  uVar90 = uVar104 + uVar94;
  uVar105 = uVar90 + uVar92;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar91;
  uVar95 = SUB168(auVar15 * ZEXT816(0xe86c90e49284eb15),8);
  uVar93 = SUB168(auVar15 * ZEXT816(0xe86c90e49284eb15),0);
  local_70 = uVar99 + uVar93;
  uVar93 = (ulong)CARRY8(uVar99,uVar93);
  uVar99 = uVar105 + uVar95;
  local_68._8_8_ =
       (ulong)(CARRY8(uVar104,uVar94) || CARRY8(uVar90,uVar92)) +
       (ulong)(CARRY8(uVar105,uVar95) || CARRY8(uVar99,uVar93));
  local_68._0_8_ = uVar99 + uVar93;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar91;
  local_68 = auVar16 * ZEXT816(0x3086d221a7d46bcd) + local_68;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = local_68;
  secp256k1_scalar_cadd_bit((secp256k1_scalar *)local_b8,0,(uint)((ulong)local_70 >> 0x3f));
  uVar91 = k->d[0];
  uVar92 = k->d[1];
  uVar93 = k->d[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar91;
  uVar94 = SUB168(auVar17 * ZEXT816(0x1571b4ae8ac47f71),8);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar94;
  local_98 = SUB168(auVar17 * ZEXT816(0x1571b4ae8ac47f71),0);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar91;
  auVar18 = auVar18 * ZEXT816(0x221208ac9df506c6);
  uVar99 = SUB168(auVar18 + auVar86,0);
  uVar104 = SUB168(auVar18 + auVar86,8);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar92;
  uVar95 = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),8);
  uVar90 = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),0);
  local_90 = uVar99 + uVar90;
  uVar90 = (ulong)CARRY8(uVar99,uVar90);
  uVar99 = uVar104 + uVar95;
  uVar105 = uVar99 + uVar90;
  uVar106 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar94,auVar18._0_8_)) +
            (ulong)(CARRY8(uVar104,uVar95) || CARRY8(uVar99,uVar90));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar91;
  uVar96 = SUB168(auVar20 * ZEXT816(0x6f547fa90abfe4c4),8);
  uVar90 = SUB168(auVar20 * ZEXT816(0x6f547fa90abfe4c4),0);
  uVar94 = uVar105 + uVar90;
  uVar90 = (ulong)CARRY8(uVar105,uVar90);
  uVar95 = uVar106 + uVar96;
  uVar107 = uVar95 + uVar90;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar92;
  uVar97 = SUB168(auVar21 * ZEXT816(0x221208ac9df506c6),8);
  uVar99 = SUB168(auVar21 * ZEXT816(0x221208ac9df506c6),0);
  uVar105 = uVar94 + uVar99;
  uVar99 = (ulong)CARRY8(uVar94,uVar99);
  uVar104 = uVar107 + uVar97;
  uVar108 = uVar104 + uVar99;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar93;
  uVar98 = SUB168(auVar22 * ZEXT816(0x1571b4ae8ac47f71),8);
  uVar94 = SUB168(auVar22 * ZEXT816(0x1571b4ae8ac47f71),0);
  local_88 = uVar105 + uVar94;
  uVar94 = (ulong)CARRY8(uVar105,uVar94);
  uVar105 = uVar108 + uVar98;
  uVar109 = uVar105 + uVar94;
  uVar100 = (ulong)(CARRY8(uVar106,uVar96) || CARRY8(uVar95,uVar90)) +
            (ulong)(CARRY8(uVar107,uVar97) || CARRY8(uVar104,uVar99)) +
            (ulong)(CARRY8(uVar108,uVar98) || CARRY8(uVar105,uVar94));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar91;
  uVar98 = SUB168(auVar23 * ZEXT816(0xe4437ed6010e8828),8);
  uVar91 = SUB168(auVar23 * ZEXT816(0xe4437ed6010e8828),0);
  uVar94 = uVar109 + uVar91;
  uVar90 = (ulong)CARRY8(uVar109,uVar91);
  uVar104 = uVar100 + uVar98;
  uVar109 = uVar104 + uVar90;
  uVar91 = k->d[3];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar92;
  uVar106 = SUB168(auVar24 * ZEXT816(0x6f547fa90abfe4c4),8);
  uVar99 = SUB168(auVar24 * ZEXT816(0x6f547fa90abfe4c4),0);
  uVar95 = uVar94 + uVar99;
  uVar99 = (ulong)CARRY8(uVar94,uVar99);
  uVar105 = uVar109 + uVar106;
  uVar101 = uVar105 + uVar99;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar93;
  uVar107 = SUB168(auVar25 * ZEXT816(0x221208ac9df506c6),8);
  uVar94 = SUB168(auVar25 * ZEXT816(0x221208ac9df506c6),0);
  uVar97 = uVar95 + uVar94;
  uVar94 = (ulong)CARRY8(uVar95,uVar94);
  uVar96 = uVar101 + uVar107;
  uVar102 = uVar96 + uVar94;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar91;
  uVar108 = SUB168(auVar26 * ZEXT816(0x1571b4ae8ac47f71),8);
  uVar95 = SUB168(auVar26 * ZEXT816(0x1571b4ae8ac47f71),0);
  local_80 = uVar97 + uVar95;
  uVar95 = (ulong)CARRY8(uVar97,uVar95);
  uVar97 = uVar102 + uVar108;
  uVar103 = uVar97 + uVar95;
  uVar98 = (ulong)(CARRY8(uVar100,uVar98) || CARRY8(uVar104,uVar90)) +
           (ulong)(CARRY8(uVar109,uVar106) || CARRY8(uVar105,uVar99)) +
           (ulong)(CARRY8(uVar101,uVar107) || CARRY8(uVar96,uVar94)) +
           (ulong)(CARRY8(uVar102,uVar108) || CARRY8(uVar97,uVar95));
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar92;
  uVar105 = SUB168(auVar27 * ZEXT816(0xe4437ed6010e8828),8);
  uVar92 = SUB168(auVar27 * ZEXT816(0xe4437ed6010e8828),0);
  uVar99 = uVar103 + uVar92;
  uVar92 = (ulong)CARRY8(uVar103,uVar92);
  uVar94 = uVar98 + uVar105;
  uVar106 = uVar94 + uVar92;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar93;
  uVar96 = SUB168(auVar28 * ZEXT816(0x6f547fa90abfe4c4),8);
  uVar90 = SUB168(auVar28 * ZEXT816(0x6f547fa90abfe4c4),0);
  uVar104 = uVar99 + uVar90;
  uVar90 = (ulong)CARRY8(uVar99,uVar90);
  uVar95 = uVar106 + uVar96;
  uVar107 = uVar95 + uVar90;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar91;
  uVar97 = SUB168(auVar29 * ZEXT816(0x221208ac9df506c6),8);
  uVar99 = SUB168(auVar29 * ZEXT816(0x221208ac9df506c6),0);
  local_78 = uVar104 + uVar99;
  uVar99 = (ulong)CARRY8(uVar104,uVar99);
  uVar104 = uVar107 + uVar97;
  uVar108 = uVar104 + uVar99;
  uVar104 = (ulong)(CARRY8(uVar98,uVar105) || CARRY8(uVar94,uVar92)) +
            (ulong)(CARRY8(uVar106,uVar96) || CARRY8(uVar95,uVar90)) +
            (ulong)(CARRY8(uVar107,uVar97) || CARRY8(uVar104,uVar99));
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar93;
  uVar94 = SUB168(auVar30 * ZEXT816(0xe4437ed6010e8828),8);
  uVar92 = SUB168(auVar30 * ZEXT816(0xe4437ed6010e8828),0);
  uVar99 = uVar108 + uVar92;
  uVar92 = (ulong)CARRY8(uVar108,uVar92);
  uVar90 = uVar104 + uVar94;
  uVar105 = uVar90 + uVar92;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar91;
  uVar95 = SUB168(auVar31 * ZEXT816(0x6f547fa90abfe4c4),8);
  uVar93 = SUB168(auVar31 * ZEXT816(0x6f547fa90abfe4c4),0);
  local_70 = uVar99 + uVar93;
  uVar93 = (ulong)CARRY8(uVar99,uVar93);
  uVar99 = uVar105 + uVar95;
  auVar81._8_8_ =
       (ulong)(CARRY8(uVar104,uVar94) || CARRY8(uVar90,uVar92)) +
       (ulong)(CARRY8(uVar105,uVar95) || CARRY8(uVar99,uVar93));
  auVar81._0_8_ = uVar99 + uVar93;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar91;
  local_68 = auVar32 * ZEXT816(0xe4437ed6010e8828) + auVar81;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = local_68;
  secp256k1_scalar_cadd_bit((secp256k1_scalar *)local_58,0,(uint)((ulong)local_70 >> 0x3f));
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_b8._0_8_;
  uVar93 = SUB168(auVar33 * ZEXT816(0x6f547fa90abfe4c3),8);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar93;
  local_98 = SUB168(auVar33 * ZEXT816(0x6f547fa90abfe4c3),0);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_b8._0_8_;
  auVar34 = auVar34 * ZEXT816(0xe4437ed6010e8828);
  uVar92 = SUB168(auVar34 + auVar87,0);
  uVar99 = SUB168(auVar34 + auVar87,8);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_b8._8_8_;
  uVar90 = SUB168(auVar35 * ZEXT816(0x6f547fa90abfe4c3),8);
  uVar91 = SUB168(auVar35 * ZEXT816(0x6f547fa90abfe4c3),0);
  local_90 = uVar92 + uVar91;
  uVar91 = (ulong)CARRY8(uVar92,uVar91);
  uVar92 = uVar99 + uVar90;
  uVar94 = uVar92 + uVar91;
  uVar96 = (ulong)CARRY8(auVar34._8_8_,(ulong)CARRY8(uVar93,auVar34._0_8_)) +
           (ulong)(CARRY8(uVar99,uVar90) || CARRY8(uVar92,uVar91));
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_b8._0_8_;
  uVar95 = SUB168(auVar36 * ZEXT816(0),8);
  uVar91 = SUB168(auVar36 * ZEXT816(0),0);
  uVar93 = uVar94 + uVar91;
  uVar91 = (ulong)CARRY8(uVar94,uVar91);
  uVar90 = uVar96 + uVar95;
  uVar97 = uVar90 + uVar91;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_b8._8_8_;
  uVar104 = SUB168(auVar37 * ZEXT816(0xe4437ed6010e8828),8);
  uVar92 = SUB168(auVar37 * ZEXT816(0xe4437ed6010e8828),0);
  uVar94 = uVar93 + uVar92;
  uVar92 = (ulong)CARRY8(uVar93,uVar92);
  uVar99 = uVar97 + uVar104;
  uVar98 = uVar99 + uVar92;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_a8;
  uVar105 = SUB168(auVar38 * ZEXT816(0x6f547fa90abfe4c3),8);
  uVar93 = SUB168(auVar38 * ZEXT816(0x6f547fa90abfe4c3),0);
  local_88 = uVar94 + uVar93;
  uVar93 = (ulong)CARRY8(uVar94,uVar93);
  uVar94 = uVar98 + uVar105;
  uVar107 = uVar94 + uVar93;
  uVar106 = (ulong)(CARRY8(uVar96,uVar95) || CARRY8(uVar90,uVar91)) +
            (ulong)(CARRY8(uVar97,uVar104) || CARRY8(uVar99,uVar92)) +
            (ulong)(CARRY8(uVar98,uVar105) || CARRY8(uVar94,uVar93));
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_b8._0_8_;
  uVar105 = SUB168(auVar39 * ZEXT816(0),8);
  uVar91 = SUB168(auVar39 * ZEXT816(0),0);
  uVar93 = uVar107 + uVar91;
  uVar91 = (ulong)CARRY8(uVar107,uVar91);
  uVar99 = uVar106 + uVar105;
  uVar107 = uVar99 + uVar91;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_b8._8_8_;
  uVar96 = SUB168(auVar40 * ZEXT816(0),8);
  uVar92 = SUB168(auVar40 * ZEXT816(0),0);
  uVar90 = uVar93 + uVar92;
  uVar92 = (ulong)CARRY8(uVar93,uVar92);
  uVar94 = uVar107 + uVar96;
  uVar108 = uVar94 + uVar92;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_a8;
  uVar97 = SUB168(auVar41 * ZEXT816(0xe4437ed6010e8828),8);
  uVar93 = SUB168(auVar41 * ZEXT816(0xe4437ed6010e8828),0);
  uVar104 = uVar90 + uVar93;
  uVar93 = (ulong)CARRY8(uVar90,uVar93);
  uVar95 = uVar108 + uVar97;
  uVar100 = uVar95 + uVar93;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uStack_a0;
  uVar98 = SUB168(auVar42 * ZEXT816(0x6f547fa90abfe4c3),8);
  uVar90 = SUB168(auVar42 * ZEXT816(0x6f547fa90abfe4c3),0);
  local_80 = uVar104 + uVar90;
  uVar90 = (ulong)CARRY8(uVar104,uVar90);
  uVar104 = uVar100 + uVar98;
  uVar109 = uVar104 + uVar90;
  uVar96 = (ulong)(CARRY8(uVar106,uVar105) || CARRY8(uVar99,uVar91)) +
           (ulong)(CARRY8(uVar107,uVar96) || CARRY8(uVar94,uVar92)) +
           (ulong)(CARRY8(uVar108,uVar97) || CARRY8(uVar95,uVar93)) +
           (ulong)(CARRY8(uVar100,uVar98) || CARRY8(uVar104,uVar90));
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_b8._8_8_;
  uVar95 = SUB168(auVar43 * ZEXT816(0),8);
  uVar91 = SUB168(auVar43 * ZEXT816(0),0);
  uVar93 = uVar109 + uVar91;
  uVar91 = (ulong)CARRY8(uVar109,uVar91);
  uVar90 = uVar96 + uVar95;
  uVar97 = uVar90 + uVar91;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_a8;
  uVar104 = SUB168(auVar44 * ZEXT816(0),8);
  uVar92 = SUB168(auVar44 * ZEXT816(0),0);
  uVar94 = uVar93 + uVar92;
  uVar92 = (ulong)CARRY8(uVar93,uVar92);
  uVar99 = uVar97 + uVar104;
  uVar98 = uVar99 + uVar92;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uStack_a0;
  uVar105 = SUB168(auVar45 * ZEXT816(0xe4437ed6010e8828),8);
  uVar93 = SUB168(auVar45 * ZEXT816(0xe4437ed6010e8828),0);
  local_78 = uVar94 + uVar93;
  uVar93 = (ulong)CARRY8(uVar94,uVar93);
  uVar94 = uVar98 + uVar105;
  uVar106 = uVar94 + uVar93;
  uVar95 = (ulong)(CARRY8(uVar96,uVar95) || CARRY8(uVar90,uVar91)) +
           (ulong)(CARRY8(uVar97,uVar104) || CARRY8(uVar99,uVar92)) +
           (ulong)(CARRY8(uVar98,uVar105) || CARRY8(uVar94,uVar93));
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_a8;
  uVar99 = SUB168(auVar46 * ZEXT816(0),8);
  uVar91 = SUB168(auVar46 * ZEXT816(0),0);
  uVar90 = uVar106 + uVar91;
  uVar91 = (ulong)CARRY8(uVar106,uVar91);
  uVar93 = uVar95 + uVar99;
  uVar104 = uVar93 + uVar91;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uStack_a0;
  uVar94 = SUB168(auVar47 * ZEXT816(0),8);
  uVar92 = SUB168(auVar47 * ZEXT816(0),0);
  local_70 = uVar90 + uVar92;
  uVar92 = (ulong)CARRY8(uVar90,uVar92);
  uVar90 = uVar104 + uVar94;
  auVar82._8_8_ =
       (ulong)(CARRY8(uVar95,uVar99) || CARRY8(uVar93,uVar91)) +
       (ulong)(CARRY8(uVar104,uVar94) || CARRY8(uVar90,uVar92));
  auVar82._0_8_ = uVar90 + uVar92;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uStack_a0;
  local_68 = auVar48 * ZEXT816(0) + auVar82;
  secp256k1_scalar_reduce_512((secp256k1_scalar *)local_b8,&local_98);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_58._0_8_;
  uVar93 = SUB168(auVar49 * ZEXT816(0xd765cda83db1562c),8);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar93;
  local_98 = SUB168(auVar49 * ZEXT816(0xd765cda83db1562c),0);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_58._0_8_;
  auVar50 = auVar50 * ZEXT816(0x8a280ac50774346d);
  uVar92 = SUB168(auVar50 + auVar88,0);
  uVar99 = SUB168(auVar50 + auVar88,8);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_58._8_8_;
  uVar90 = SUB168(auVar51 * ZEXT816(0xd765cda83db1562c),8);
  uVar91 = SUB168(auVar51 * ZEXT816(0xd765cda83db1562c),0);
  local_90 = uVar92 + uVar91;
  uVar91 = (ulong)CARRY8(uVar92,uVar91);
  uVar92 = uVar99 + uVar90;
  uVar94 = uVar92 + uVar91;
  uVar96 = (ulong)CARRY8(auVar50._8_8_,(ulong)CARRY8(uVar93,auVar50._0_8_)) +
           (ulong)(CARRY8(uVar99,uVar90) || CARRY8(uVar92,uVar91));
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_58._0_8_;
  uVar95 = SUB168(auVar52 * ZEXT816(0xfffffffffffffffe),8);
  uVar91 = SUB168(auVar52 * ZEXT816(0xfffffffffffffffe),0);
  uVar93 = uVar94 + uVar91;
  uVar91 = (ulong)CARRY8(uVar94,uVar91);
  uVar90 = uVar96 + uVar95;
  uVar97 = uVar90 + uVar91;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_58._8_8_;
  uVar104 = SUB168(auVar53 * ZEXT816(0x8a280ac50774346d),8);
  uVar92 = SUB168(auVar53 * ZEXT816(0x8a280ac50774346d),0);
  uVar94 = uVar93 + uVar92;
  uVar92 = (ulong)CARRY8(uVar93,uVar92);
  uVar99 = uVar97 + uVar104;
  uVar98 = uVar99 + uVar92;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_48;
  uVar105 = SUB168(auVar54 * ZEXT816(0xd765cda83db1562c),8);
  uVar93 = SUB168(auVar54 * ZEXT816(0xd765cda83db1562c),0);
  local_88 = uVar94 + uVar93;
  uVar93 = (ulong)CARRY8(uVar94,uVar93);
  uVar94 = uVar98 + uVar105;
  uVar107 = uVar94 + uVar93;
  uVar106 = (ulong)(CARRY8(uVar96,uVar95) || CARRY8(uVar90,uVar91)) +
            (ulong)(CARRY8(uVar97,uVar104) || CARRY8(uVar99,uVar92)) +
            (ulong)(CARRY8(uVar98,uVar105) || CARRY8(uVar94,uVar93));
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_58._0_8_;
  uVar105 = SUB168(auVar55 * ZEXT816(0xffffffffffffffff),8);
  uVar91 = SUB168(auVar55 * ZEXT816(0xffffffffffffffff),0);
  uVar93 = uVar107 + uVar91;
  uVar91 = (ulong)CARRY8(uVar107,uVar91);
  uVar99 = uVar106 + uVar105;
  uVar107 = uVar99 + uVar91;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_58._8_8_;
  uVar96 = SUB168(auVar56 * ZEXT816(0xfffffffffffffffe),8);
  uVar92 = SUB168(auVar56 * ZEXT816(0xfffffffffffffffe),0);
  uVar90 = uVar93 + uVar92;
  uVar92 = (ulong)CARRY8(uVar93,uVar92);
  uVar94 = uVar107 + uVar96;
  uVar108 = uVar94 + uVar92;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_48;
  uVar97 = SUB168(auVar57 * ZEXT816(0x8a280ac50774346d),8);
  uVar93 = SUB168(auVar57 * ZEXT816(0x8a280ac50774346d),0);
  uVar104 = uVar90 + uVar93;
  uVar93 = (ulong)CARRY8(uVar90,uVar93);
  uVar95 = uVar108 + uVar97;
  uVar100 = uVar95 + uVar93;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uStack_40;
  uVar98 = SUB168(auVar58 * ZEXT816(0xd765cda83db1562c),8);
  uVar90 = SUB168(auVar58 * ZEXT816(0xd765cda83db1562c),0);
  local_80 = uVar104 + uVar90;
  uVar90 = (ulong)CARRY8(uVar104,uVar90);
  uVar104 = uVar100 + uVar98;
  uVar109 = uVar104 + uVar90;
  uVar96 = (ulong)(CARRY8(uVar106,uVar105) || CARRY8(uVar99,uVar91)) +
           (ulong)(CARRY8(uVar107,uVar96) || CARRY8(uVar94,uVar92)) +
           (ulong)(CARRY8(uVar108,uVar97) || CARRY8(uVar95,uVar93)) +
           (ulong)(CARRY8(uVar100,uVar98) || CARRY8(uVar104,uVar90));
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_58._8_8_;
  uVar95 = SUB168(auVar59 * ZEXT816(0xffffffffffffffff),8);
  uVar91 = SUB168(auVar59 * ZEXT816(0xffffffffffffffff),0);
  uVar93 = uVar109 + uVar91;
  uVar91 = (ulong)CARRY8(uVar109,uVar91);
  uVar90 = uVar96 + uVar95;
  uVar97 = uVar90 + uVar91;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_48;
  uVar104 = SUB168(auVar60 * ZEXT816(0xfffffffffffffffe),8);
  uVar92 = SUB168(auVar60 * ZEXT816(0xfffffffffffffffe),0);
  uVar94 = uVar93 + uVar92;
  uVar92 = (ulong)CARRY8(uVar93,uVar92);
  uVar99 = uVar97 + uVar104;
  uVar98 = uVar99 + uVar92;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uStack_40;
  uVar105 = SUB168(auVar61 * ZEXT816(0x8a280ac50774346d),8);
  uVar93 = SUB168(auVar61 * ZEXT816(0x8a280ac50774346d),0);
  local_78 = uVar94 + uVar93;
  uVar93 = (ulong)CARRY8(uVar94,uVar93);
  uVar94 = uVar98 + uVar105;
  uVar106 = uVar94 + uVar93;
  uVar95 = (ulong)(CARRY8(uVar96,uVar95) || CARRY8(uVar90,uVar91)) +
           (ulong)(CARRY8(uVar97,uVar104) || CARRY8(uVar99,uVar92)) +
           (ulong)(CARRY8(uVar98,uVar105) || CARRY8(uVar94,uVar93));
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_48;
  uVar99 = SUB168(auVar62 * ZEXT816(0xffffffffffffffff),8);
  uVar91 = SUB168(auVar62 * ZEXT816(0xffffffffffffffff),0);
  uVar90 = uVar106 + uVar91;
  uVar91 = (ulong)CARRY8(uVar106,uVar91);
  uVar93 = uVar95 + uVar99;
  uVar104 = uVar93 + uVar91;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uStack_40;
  uVar94 = SUB168(auVar63 * ZEXT816(0xfffffffffffffffe),8);
  uVar92 = SUB168(auVar63 * ZEXT816(0xfffffffffffffffe),0);
  local_70 = uVar90 + uVar92;
  uVar92 = (ulong)CARRY8(uVar90,uVar92);
  uVar90 = uVar104 + uVar94;
  auVar83._8_8_ =
       (ulong)(CARRY8(uVar95,uVar99) || CARRY8(uVar93,uVar91)) +
       (ulong)(CARRY8(uVar104,uVar94) || CARRY8(uVar90,uVar92));
  auVar83._0_8_ = uVar90 + uVar92;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uStack_40;
  local_68 = auVar64 * ZEXT816(0xffffffffffffffff) + auVar83;
  secp256k1_scalar_reduce_512((secp256k1_scalar *)local_58,&local_98);
  secp256k1_scalar_add(r2,(secp256k1_scalar *)local_b8,(secp256k1_scalar *)local_58);
  uVar91 = r2->d[0];
  uVar92 = r2->d[1];
  uVar93 = r2->d[2];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar91;
  uVar94 = SUB168(auVar65 * ZEXT816(0xdf02967c1b23bd72),8);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar94;
  local_98 = SUB168(auVar65 * ZEXT816(0xdf02967c1b23bd72),0);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar91;
  auVar66 = auVar66 * ZEXT816(0x122e22ea20816678);
  uVar99 = SUB168(auVar66 + auVar89,0);
  uVar104 = SUB168(auVar66 + auVar89,8);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar92;
  uVar95 = SUB168(auVar67 * ZEXT816(0xdf02967c1b23bd72),8);
  uVar90 = SUB168(auVar67 * ZEXT816(0xdf02967c1b23bd72),0);
  local_90 = uVar99 + uVar90;
  uVar90 = (ulong)CARRY8(uVar99,uVar90);
  uVar99 = uVar104 + uVar95;
  uVar105 = uVar99 + uVar90;
  uVar106 = (ulong)CARRY8(auVar66._8_8_,(ulong)CARRY8(uVar94,auVar66._0_8_)) +
            (ulong)(CARRY8(uVar104,uVar95) || CARRY8(uVar99,uVar90));
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar91;
  uVar96 = SUB168(auVar68 * ZEXT816(0xa5261c028812645a),8);
  uVar90 = SUB168(auVar68 * ZEXT816(0xa5261c028812645a),0);
  uVar94 = uVar105 + uVar90;
  uVar90 = (ulong)CARRY8(uVar105,uVar90);
  uVar95 = uVar106 + uVar96;
  uVar107 = uVar95 + uVar90;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar92;
  uVar97 = SUB168(auVar69 * ZEXT816(0x122e22ea20816678),8);
  uVar99 = SUB168(auVar69 * ZEXT816(0x122e22ea20816678),0);
  uVar105 = uVar94 + uVar99;
  uVar99 = (ulong)CARRY8(uVar94,uVar99);
  uVar104 = uVar107 + uVar97;
  uVar108 = uVar104 + uVar99;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar93;
  uVar98 = SUB168(auVar70 * ZEXT816(0xdf02967c1b23bd72),8);
  uVar94 = SUB168(auVar70 * ZEXT816(0xdf02967c1b23bd72),0);
  local_88 = uVar105 + uVar94;
  uVar94 = (ulong)CARRY8(uVar105,uVar94);
  uVar105 = uVar108 + uVar98;
  uVar109 = uVar105 + uVar94;
  uVar100 = (ulong)(CARRY8(uVar106,uVar96) || CARRY8(uVar95,uVar90)) +
            (ulong)(CARRY8(uVar107,uVar97) || CARRY8(uVar104,uVar99)) +
            (ulong)(CARRY8(uVar108,uVar98) || CARRY8(uVar105,uVar94));
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar91;
  uVar98 = SUB168(auVar71 * ZEXT816(0x5363ad4cc05c30e0),8);
  uVar91 = SUB168(auVar71 * ZEXT816(0x5363ad4cc05c30e0),0);
  uVar94 = uVar109 + uVar91;
  uVar90 = (ulong)CARRY8(uVar109,uVar91);
  uVar104 = uVar100 + uVar98;
  uVar109 = uVar104 + uVar90;
  uVar91 = r2->d[3];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar92;
  uVar106 = SUB168(auVar72 * ZEXT816(0xa5261c028812645a),8);
  uVar99 = SUB168(auVar72 * ZEXT816(0xa5261c028812645a),0);
  uVar95 = uVar94 + uVar99;
  uVar99 = (ulong)CARRY8(uVar94,uVar99);
  uVar105 = uVar109 + uVar106;
  uVar101 = uVar105 + uVar99;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar93;
  uVar107 = SUB168(auVar73 * ZEXT816(0x122e22ea20816678),8);
  uVar94 = SUB168(auVar73 * ZEXT816(0x122e22ea20816678),0);
  uVar97 = uVar95 + uVar94;
  uVar94 = (ulong)CARRY8(uVar95,uVar94);
  uVar96 = uVar101 + uVar107;
  uVar102 = uVar96 + uVar94;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar91;
  uVar108 = SUB168(auVar74 * ZEXT816(0xdf02967c1b23bd72),8);
  uVar95 = SUB168(auVar74 * ZEXT816(0xdf02967c1b23bd72),0);
  local_80 = uVar97 + uVar95;
  uVar95 = (ulong)CARRY8(uVar97,uVar95);
  uVar97 = uVar102 + uVar108;
  uVar103 = uVar97 + uVar95;
  uVar98 = (ulong)(CARRY8(uVar100,uVar98) || CARRY8(uVar104,uVar90)) +
           (ulong)(CARRY8(uVar109,uVar106) || CARRY8(uVar105,uVar99)) +
           (ulong)(CARRY8(uVar101,uVar107) || CARRY8(uVar96,uVar94)) +
           (ulong)(CARRY8(uVar102,uVar108) || CARRY8(uVar97,uVar95));
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar92;
  uVar105 = SUB168(auVar75 * ZEXT816(0x5363ad4cc05c30e0),8);
  uVar92 = SUB168(auVar75 * ZEXT816(0x5363ad4cc05c30e0),0);
  uVar99 = uVar103 + uVar92;
  uVar92 = (ulong)CARRY8(uVar103,uVar92);
  uVar94 = uVar98 + uVar105;
  uVar106 = uVar94 + uVar92;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar93;
  uVar96 = SUB168(auVar76 * ZEXT816(0xa5261c028812645a),8);
  uVar90 = SUB168(auVar76 * ZEXT816(0xa5261c028812645a),0);
  uVar104 = uVar99 + uVar90;
  uVar90 = (ulong)CARRY8(uVar99,uVar90);
  uVar95 = uVar106 + uVar96;
  uVar107 = uVar95 + uVar90;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar91;
  uVar97 = SUB168(auVar77 * ZEXT816(0x122e22ea20816678),8);
  uVar99 = SUB168(auVar77 * ZEXT816(0x122e22ea20816678),0);
  local_78 = uVar104 + uVar99;
  uVar99 = (ulong)CARRY8(uVar104,uVar99);
  uVar104 = uVar107 + uVar97;
  uVar108 = uVar104 + uVar99;
  uVar104 = (ulong)(CARRY8(uVar98,uVar105) || CARRY8(uVar94,uVar92)) +
            (ulong)(CARRY8(uVar106,uVar96) || CARRY8(uVar95,uVar90)) +
            (ulong)(CARRY8(uVar107,uVar97) || CARRY8(uVar104,uVar99));
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar93;
  uVar94 = SUB168(auVar78 * ZEXT816(0x5363ad4cc05c30e0),8);
  uVar92 = SUB168(auVar78 * ZEXT816(0x5363ad4cc05c30e0),0);
  uVar99 = uVar108 + uVar92;
  uVar92 = (ulong)CARRY8(uVar108,uVar92);
  uVar90 = uVar104 + uVar94;
  uVar105 = uVar90 + uVar92;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar91;
  uVar95 = SUB168(auVar79 * ZEXT816(0xa5261c028812645a),8);
  uVar93 = SUB168(auVar79 * ZEXT816(0xa5261c028812645a),0);
  local_70 = uVar99 + uVar93;
  uVar93 = (ulong)CARRY8(uVar99,uVar93);
  uVar99 = uVar105 + uVar95;
  auVar84._8_8_ =
       (ulong)(CARRY8(uVar104,uVar94) || CARRY8(uVar90,uVar92)) +
       (ulong)(CARRY8(uVar105,uVar95) || CARRY8(uVar99,uVar93));
  auVar84._0_8_ = uVar99 + uVar93;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar91;
  local_68 = auVar80 * ZEXT816(0x5363ad4cc05c30e0) + auVar84;
  secp256k1_scalar_reduce_512(r1,&local_98);
  secp256k1_scalar_negate(r1,r1);
  secp256k1_scalar_add(r1,r1,k);
  return;
}

Assistant:

static void secp256k1_scalar_split_lambda(secp256k1_scalar *r1, secp256k1_scalar *r2, const secp256k1_scalar *k) {
    secp256k1_scalar c1, c2;
    static const secp256k1_scalar minus_b1 = SECP256K1_SCALAR_CONST(
        0x00000000UL, 0x00000000UL, 0x00000000UL, 0x00000000UL,
        0xE4437ED6UL, 0x010E8828UL, 0x6F547FA9UL, 0x0ABFE4C3UL
    );
    static const secp256k1_scalar minus_b2 = SECP256K1_SCALAR_CONST(
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFEUL,
        0x8A280AC5UL, 0x0774346DUL, 0xD765CDA8UL, 0x3DB1562CUL
    );
    static const secp256k1_scalar g1 = SECP256K1_SCALAR_CONST(
        0x3086D221UL, 0xA7D46BCDUL, 0xE86C90E4UL, 0x9284EB15UL,
        0x3DAA8A14UL, 0x71E8CA7FUL, 0xE893209AUL, 0x45DBB031UL
    );
    static const secp256k1_scalar g2 = SECP256K1_SCALAR_CONST(
        0xE4437ED6UL, 0x010E8828UL, 0x6F547FA9UL, 0x0ABFE4C4UL,
        0x221208ACUL, 0x9DF506C6UL, 0x1571B4AEUL, 0x8AC47F71UL
    );
    VERIFY_CHECK(r1 != k);
    VERIFY_CHECK(r2 != k);
    /* these _var calls are constant time since the shift amount is constant */
    secp256k1_scalar_mul_shift_var(&c1, k, &g1, 384);
    secp256k1_scalar_mul_shift_var(&c2, k, &g2, 384);
    secp256k1_scalar_mul(&c1, &c1, &minus_b1);
    secp256k1_scalar_mul(&c2, &c2, &minus_b2);
    secp256k1_scalar_add(r2, &c1, &c2);
    secp256k1_scalar_mul(r1, r2, &secp256k1_const_lambda);
    secp256k1_scalar_negate(r1, r1);
    secp256k1_scalar_add(r1, r1, k);

#ifdef VERIFY
    secp256k1_scalar_split_lambda_verify(r1, r2, k);
#endif
}